

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O3

void __thiscall PrintfTest_IntPrecision_Test::TestBody(PrintfTest_IntPrecision_Test *this)

{
  AssertHelperData *pAVar1;
  bool bVar2;
  char *pcVar3;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  string_view format_11;
  string_view format_12;
  string_view format_13;
  string_view format_14;
  string_view format_15;
  string_view format_16;
  string_view format_17;
  string_view format_18;
  string_view format_19;
  string_view format_20;
  string_view format_21;
  string_view format_22;
  string_view format_23;
  string_view format_24;
  string_view format_25;
  string_view format_26;
  string_view format_27;
  string_view format_28;
  string_view format_29;
  string_view format_30;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  internal local_2e0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d8;
  undefined1 local_2d0 [32];
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  local_2b0;
  string local_278;
  undefined8 local_258 [2];
  undefined1 local_248 [32];
  char local_228 [504];
  
  local_2d0._0_4_ = 0x2a;
  format.size_ = 4;
  format.data_ = "%.5d";
  test_sprintf<int>((string *)local_248,format,(int *)local_2d0);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_2b0,"\"00042\"","test_sprintf(\"%.5d\", 42)",(char (*) [6])0x2043c1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_2b0.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_248._0_8_ + 0x10),"%.5d",4)
    ;
    if ((undefined8 *)
        local_2b0.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2b0.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xe7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((long *)local_248._0_8_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_248._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b0.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_00.size_ = 4;
  format_00.data_ = "%.5d";
  make_positional_abi_cxx11_(&local_278,format_00);
  local_258[0] = 0x2a;
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_0023bf40;
  local_248._24_8_ = 500;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_278._M_dataplus._M_p;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_278._M_string_length;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
       ::TYPES;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_248;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_258;
  local_248._8_8_ = local_228;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_2b0);
  pAVar1 = (AssertHelperData *)(local_2d0 + 0x10);
  local_2d0._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,local_248._8_8_,(char *)(local_248._8_8_ + local_248._16_8_));
  local_248._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_2e0,"\"00042\"","fmt::sprintf(make_positional(\"%.5d\"), 42)",
             (char (*) [6])0x2043c1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  if ((AssertHelperData *)local_2d0._0_8_ != pAVar1) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if (local_2d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xe7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d0._0_4_ = 0xffffffd6;
  format_01.size_ = 4;
  format_01.data_ = "%.5d";
  test_sprintf<int>((string *)local_248,format_01,(int *)local_2d0);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_2b0,"\"-00042\"","test_sprintf(\"%.5d\", -42)",
             (char (*) [7])"-00042",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_2b0.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_248._0_8_ + 0x10),"%.5d",4)
    ;
    if ((undefined8 *)
        local_2b0.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2b0.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xe8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b0.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_02.size_ = 4;
  format_02.data_ = "%.5d";
  make_positional_abi_cxx11_(&local_278,format_02);
  local_258[0] = 0xffffffd6;
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_0023bf40;
  local_248._24_8_ = 500;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_278._M_dataplus._M_p;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_278._M_string_length;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
       ::TYPES;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_248;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_258;
  local_248._8_8_ = local_228;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_2b0);
  local_2d0._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,local_248._8_8_,(char *)(local_248._8_8_ + local_248._16_8_));
  local_248._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            (local_2e0,"\"-00042\"","fmt::sprintf(make_positional(\"%.5d\"), -42)",
             (char (*) [7])"-00042",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  if ((AssertHelperData *)local_2d0._0_8_ != pAVar1) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if (local_2d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xe8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d0._0_4_ = 0x42;
  format_03.size_ = 4;
  format_03.data_ = "%.5x";
  test_sprintf<int>((string *)local_248,format_03,(int *)local_2d0);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_2b0,"\"00042\"","test_sprintf(\"%.5x\", 0x42)",
             (char (*) [6])0x2043c1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_2b0.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_248._0_8_ + 0x10),"%.5x",4)
    ;
    if ((undefined8 *)
        local_2b0.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2b0.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xe9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b0.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_04.size_ = 4;
  format_04.data_ = "%.5x";
  make_positional_abi_cxx11_(&local_278,format_04);
  local_258[0] = 0x42;
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_0023bf40;
  local_248._24_8_ = 500;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_278._M_dataplus._M_p;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_278._M_string_length;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
       ::TYPES;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_248;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_258;
  local_248._8_8_ = local_228;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_2b0);
  local_2d0._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,local_248._8_8_,(char *)(local_248._8_8_ + local_248._16_8_));
  local_248._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_2e0,"\"00042\"","fmt::sprintf(make_positional(\"%.5x\"), 0x42)",
             (char (*) [6])0x2043c1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  if ((AssertHelperData *)local_2d0._0_8_ != pAVar1) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if (local_2d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xe9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d0._0_4_ = 0x42;
  format_05.size_ = 5;
  format_05.data_ = "%#.5x";
  test_sprintf<int>((string *)local_248,format_05,(int *)local_2d0);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&local_2b0,"\"0x00042\"","test_sprintf(\"%#.5x\", 0x42)",
             (char (*) [8])0x204306,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_2b0.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"%#.5x",5);
    if ((undefined8 *)
        local_2b0.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2b0.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xea,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b0.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_06.size_ = 5;
  format_06.data_ = "%#.5x";
  make_positional_abi_cxx11_(&local_278,format_06);
  local_258[0] = 0x42;
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_0023bf40;
  local_248._24_8_ = 500;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_278._M_dataplus._M_p;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_278._M_string_length;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
       ::TYPES;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_248;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_258;
  local_248._8_8_ = local_228;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_2b0);
  local_2d0._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,local_248._8_8_,(char *)(local_248._8_8_ + local_248._16_8_));
  local_248._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            (local_2e0,"\"0x00042\"","fmt::sprintf(make_positional(\"%#.5x\"), 0x42)",
             (char (*) [8])0x204306,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  if ((AssertHelperData *)local_2d0._0_8_ != pAVar1) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if (local_2d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xea,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d0._0_4_ = 0x22;
  format_07.size_ = 4;
  format_07.data_ = "%.5o";
  test_sprintf<int>((string *)local_248,format_07,(int *)local_2d0);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_2b0,"\"00042\"","test_sprintf(\"%.5o\", 042)",(char (*) [6])0x2043c1
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_2b0.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_248._0_8_ + 0x10),"%.5o",4)
    ;
    if ((undefined8 *)
        local_2b0.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2b0.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xeb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b0.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_08.size_ = 4;
  format_08.data_ = "%.5o";
  make_positional_abi_cxx11_(&local_278,format_08);
  local_258[0] = 0x22;
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_0023bf40;
  local_248._24_8_ = 500;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_278._M_dataplus._M_p;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_278._M_string_length;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
       ::TYPES;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_248;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_258;
  local_248._8_8_ = local_228;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_2b0);
  local_2d0._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,local_248._8_8_,(char *)(local_248._8_8_ + local_248._16_8_));
  local_248._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_2e0,"\"00042\"","fmt::sprintf(make_positional(\"%.5o\"), 042)",
             (char (*) [6])0x2043c1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  if ((AssertHelperData *)local_2d0._0_8_ != pAVar1) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if (local_2d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xeb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d0._0_4_ = 0x22;
  format_09.size_ = 5;
  format_09.data_ = "%#.5o";
  test_sprintf<int>((string *)local_248,format_09,(int *)local_2d0);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_2b0,"\"00042\"","test_sprintf(\"%#.5o\", 042)",
             (char (*) [6])0x2043c1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_2b0.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"%#.5o",5);
    if ((undefined8 *)
        local_2b0.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2b0.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xec,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b0.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_10.size_ = 5;
  format_10.data_ = "%#.5o";
  make_positional_abi_cxx11_(&local_278,format_10);
  local_258[0] = 0x22;
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_0023bf40;
  local_248._24_8_ = 500;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_278._M_dataplus._M_p;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_278._M_string_length;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
       ::TYPES;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_248;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_258;
  local_248._8_8_ = local_228;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_2b0);
  local_2d0._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,local_248._8_8_,(char *)(local_248._8_8_ + local_248._16_8_));
  local_248._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_2e0,"\"00042\"","fmt::sprintf(make_positional(\"%#.5o\"), 042)",
             (char (*) [6])0x2043c1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  if ((AssertHelperData *)local_2d0._0_8_ != pAVar1) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if (local_2d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xec,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d0._0_4_ = 0x2a;
  format_11.size_ = 5;
  format_11.data_ = "%7.5d";
  test_sprintf<int>((string *)local_248,format_11,(int *)local_2d0);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&local_2b0,"\"  00042\"","test_sprintf(\"%7.5d\", 42)",
             (char (*) [8])0x2043bf,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_2b0.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"%7.5d",5);
    if ((undefined8 *)
        local_2b0.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2b0.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xee,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b0.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_12.size_ = 5;
  format_12.data_ = "%7.5d";
  make_positional_abi_cxx11_(&local_278,format_12);
  local_258[0] = 0x2a;
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_0023bf40;
  local_248._24_8_ = 500;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_278._M_dataplus._M_p;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_278._M_string_length;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
       ::TYPES;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_248;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_258;
  local_248._8_8_ = local_228;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_2b0);
  local_2d0._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,local_248._8_8_,(char *)(local_248._8_8_ + local_248._16_8_));
  local_248._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            (local_2e0,"\"  00042\"","fmt::sprintf(make_positional(\"%7.5d\"), 42)",
             (char (*) [8])0x2043bf,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  if ((AssertHelperData *)local_2d0._0_8_ != pAVar1) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if (local_2d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xee,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d0._0_4_ = 0x42;
  format_13.size_ = 5;
  format_13.data_ = "%7.5x";
  test_sprintf<int>((string *)local_248,format_13,(int *)local_2d0);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&local_2b0,"\"  00042\"","test_sprintf(\"%7.5x\", 0x42)",
             (char (*) [8])0x2043bf,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_2b0.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"%7.5x",5);
    if ((undefined8 *)
        local_2b0.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2b0.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xef,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b0.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_14.size_ = 5;
  format_14.data_ = "%7.5x";
  make_positional_abi_cxx11_(&local_278,format_14);
  local_258[0] = 0x42;
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_0023bf40;
  local_248._24_8_ = 500;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_278._M_dataplus._M_p;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_278._M_string_length;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
       ::TYPES;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_248;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_258;
  local_248._8_8_ = local_228;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_2b0);
  local_2d0._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,local_248._8_8_,(char *)(local_248._8_8_ + local_248._16_8_));
  local_248._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            (local_2e0,"\"  00042\"","fmt::sprintf(make_positional(\"%7.5x\"), 0x42)",
             (char (*) [8])0x2043bf,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  if ((AssertHelperData *)local_2d0._0_8_ != pAVar1) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if (local_2d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xef,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d0._0_4_ = 0x42;
  format_15.size_ = 7;
  format_15.data_ = "%#10.5x";
  test_sprintf<int>((string *)local_248,format_15,(int *)local_2d0);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&local_2b0,"\"   0x00042\"","test_sprintf(\"%#10.5x\", 0x42)",
             (char (*) [11])"   0x00042",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_2b0.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"%#10.5x",7);
    if ((undefined8 *)
        local_2b0.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2b0.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b0.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_16.size_ = 7;
  format_16.data_ = "%#10.5x";
  make_positional_abi_cxx11_(&local_278,format_16);
  local_258[0] = 0x42;
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_0023bf40;
  local_248._24_8_ = 500;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_278._M_dataplus._M_p;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_278._M_string_length;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
       ::TYPES;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_248;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_258;
  local_248._8_8_ = local_228;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_2b0);
  local_2d0._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,local_248._8_8_,(char *)(local_248._8_8_ + local_248._16_8_));
  local_248._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            (local_2e0,"\"   0x00042\"","fmt::sprintf(make_positional(\"%#10.5x\"), 0x42)",
             (char (*) [11])"   0x00042",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  if ((AssertHelperData *)local_2d0._0_8_ != pAVar1) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if (local_2d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d0._0_4_ = 0x22;
  format_17.size_ = 5;
  format_17.data_ = "%7.5o";
  test_sprintf<int>((string *)local_248,format_17,(int *)local_2d0);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&local_2b0,"\"  00042\"","test_sprintf(\"%7.5o\", 042)",
             (char (*) [8])0x2043bf,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_2b0.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"%7.5o",5);
    if ((undefined8 *)
        local_2b0.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2b0.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b0.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_18.size_ = 5;
  format_18.data_ = "%7.5o";
  make_positional_abi_cxx11_(&local_278,format_18);
  local_258[0] = 0x22;
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_0023bf40;
  local_248._24_8_ = 500;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_278._M_dataplus._M_p;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_278._M_string_length;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
       ::TYPES;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_248;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_258;
  local_248._8_8_ = local_228;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_2b0);
  local_2d0._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,local_248._8_8_,(char *)(local_248._8_8_ + local_248._16_8_));
  local_248._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            (local_2e0,"\"  00042\"","fmt::sprintf(make_positional(\"%7.5o\"), 042)",
             (char (*) [8])0x2043bf,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  if ((AssertHelperData *)local_2d0._0_8_ != pAVar1) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if (local_2d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d0._0_4_ = 0x22;
  format_19.size_ = 7;
  format_19.data_ = "%#10.5o";
  test_sprintf<int>((string *)local_248,format_19,(int *)local_2d0);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&local_2b0,"\"     00042\"","test_sprintf(\"%#10.5o\", 042)",
             (char (*) [11])"     00042",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_2b0.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"%#10.5o",7);
    if ((undefined8 *)
        local_2b0.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2b0.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b0.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_20.size_ = 7;
  format_20.data_ = "%#10.5o";
  make_positional_abi_cxx11_(&local_278,format_20);
  local_258[0] = 0x22;
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_0023bf40;
  local_248._24_8_ = 500;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_278._M_dataplus._M_p;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_278._M_string_length;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
       ::TYPES;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_248;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_258;
  local_248._8_8_ = local_228;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_2b0);
  local_2d0._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,local_248._8_8_,(char *)(local_248._8_8_ + local_248._16_8_));
  local_248._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            (local_2e0,"\"     00042\"","fmt::sprintf(make_positional(\"%#10.5o\"), 042)",
             (char (*) [11])"     00042",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  if ((AssertHelperData *)local_2d0._0_8_ != pAVar1) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if (local_2d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d0._0_4_ = 0x2a;
  format_21.size_ = 6;
  format_21.data_ = "%-7.5d";
  test_sprintf<int>((string *)local_248,format_21,(int *)local_2d0);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&local_2b0,"\"00042  \"","test_sprintf(\"%-7.5d\", 42)",
             (char (*) [8])"00042  ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_2b0.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"%-7.5d",6);
    if ((undefined8 *)
        local_2b0.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2b0.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b0.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_22.size_ = 6;
  format_22.data_ = "%-7.5d";
  make_positional_abi_cxx11_(&local_278,format_22);
  local_258[0] = 0x2a;
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_0023bf40;
  local_248._24_8_ = 500;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_278._M_dataplus._M_p;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_278._M_string_length;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
       ::TYPES;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_248;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_258;
  local_248._8_8_ = local_228;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_2b0);
  local_2d0._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,local_248._8_8_,(char *)(local_248._8_8_ + local_248._16_8_));
  local_248._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            (local_2e0,"\"00042  \"","fmt::sprintf(make_positional(\"%-7.5d\"), 42)",
             (char (*) [8])"00042  ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  if ((AssertHelperData *)local_2d0._0_8_ != pAVar1) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if (local_2d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d0._0_4_ = 0x42;
  format_23.size_ = 6;
  format_23.data_ = "%-7.5x";
  test_sprintf<int>((string *)local_248,format_23,(int *)local_2d0);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&local_2b0,"\"00042  \"","test_sprintf(\"%-7.5x\", 0x42)",
             (char (*) [8])"00042  ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_2b0.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"%-7.5x",6);
    if ((undefined8 *)
        local_2b0.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2b0.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b0.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_24.size_ = 6;
  format_24.data_ = "%-7.5x";
  make_positional_abi_cxx11_(&local_278,format_24);
  local_258[0] = 0x42;
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_0023bf40;
  local_248._24_8_ = 500;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_278._M_dataplus._M_p;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_278._M_string_length;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
       ::TYPES;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_248;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_258;
  local_248._8_8_ = local_228;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_2b0);
  local_2d0._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,local_248._8_8_,(char *)(local_248._8_8_ + local_248._16_8_));
  local_248._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            (local_2e0,"\"00042  \"","fmt::sprintf(make_positional(\"%-7.5x\"), 0x42)",
             (char (*) [8])"00042  ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  if ((AssertHelperData *)local_2d0._0_8_ != pAVar1) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if (local_2d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d0._0_4_ = 0x42;
  format_25.size_ = 8;
  format_25.data_ = "%-#10.5x";
  test_sprintf<int>((string *)local_248,format_25,(int *)local_2d0);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&local_2b0,"\"0x00042   \"","test_sprintf(\"%-#10.5x\", 0x42)",
             (char (*) [11])"0x00042   ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_2b0.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"%-#10.5x",8);
    if ((undefined8 *)
        local_2b0.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2b0.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b0.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_26.size_ = 8;
  format_26.data_ = "%-#10.5x";
  make_positional_abi_cxx11_(&local_278,format_26);
  local_258[0] = 0x42;
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_0023bf40;
  local_248._24_8_ = 500;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_278._M_dataplus._M_p;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_278._M_string_length;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
       ::TYPES;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_248;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_258;
  local_248._8_8_ = local_228;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_2b0);
  local_2d0._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,local_248._8_8_,(char *)(local_248._8_8_ + local_248._16_8_));
  local_248._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            (local_2e0,"\"0x00042   \"","fmt::sprintf(make_positional(\"%-#10.5x\"), 0x42)",
             (char (*) [11])"0x00042   ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  if ((AssertHelperData *)local_2d0._0_8_ != pAVar1) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if (local_2d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d0._0_4_ = 0x22;
  format_27.size_ = 6;
  format_27.data_ = "%-7.5o";
  test_sprintf<int>((string *)local_248,format_27,(int *)local_2d0);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&local_2b0,"\"00042  \"","test_sprintf(\"%-7.5o\", 042)",
             (char (*) [8])"00042  ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_2b0.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"%-7.5o",6);
    if ((undefined8 *)
        local_2b0.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2b0.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b0.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_28.size_ = 6;
  format_28.data_ = "%-7.5o";
  make_positional_abi_cxx11_(&local_278,format_28);
  local_258[0] = 0x22;
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_0023bf40;
  local_248._24_8_ = 500;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_278._M_dataplus._M_p;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_278._M_string_length;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
       ::TYPES;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_248;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_258;
  local_248._8_8_ = local_228;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_2b0);
  local_2d0._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,local_248._8_8_,(char *)(local_248._8_8_ + local_248._16_8_));
  local_248._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            (local_2e0,"\"00042  \"","fmt::sprintf(make_positional(\"%-7.5o\"), 042)",
             (char (*) [8])"00042  ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  if ((AssertHelperData *)local_2d0._0_8_ != pAVar1) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if (local_2d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d0._0_4_ = 0x22;
  format_29.size_ = 8;
  format_29.data_ = "%-#10.5o";
  test_sprintf<int>((string *)local_248,format_29,(int *)local_2d0);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&local_2b0,"\"00042     \"","test_sprintf(\"%-#10.5o\", 042)",
             (char (*) [11])"00042     ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_2b0.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"%-#10.5o",8);
    if ((undefined8 *)
        local_2b0.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2b0.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b0.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_30.size_ = 8;
  format_30.data_ = "%-#10.5o";
  make_positional_abi_cxx11_(&local_278,format_30);
  local_258[0] = 0x22;
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_0023bf40;
  local_248._24_8_ = 500;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_278._M_dataplus._M_p;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_278._M_string_length;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
       ::TYPES;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_248;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_258;
  local_248._8_8_ = local_228;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_2b0);
  local_2d0._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,local_248._8_8_,(char *)(local_248._8_8_ + local_248._16_8_));
  local_248._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            (local_2e0,"\"00042     \"","fmt::sprintf(make_positional(\"%-#10.5o\"), 042)",
             (char (*) [11])"00042     ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  if ((AssertHelperData *)local_2d0._0_8_ != pAVar1) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if (local_2d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(PrintfTest, IntPrecision) {
  EXPECT_PRINTF("00042", "%.5d", 42);
  EXPECT_PRINTF("-00042", "%.5d", -42);
  EXPECT_PRINTF("00042", "%.5x", 0x42);
  EXPECT_PRINTF("0x00042", "%#.5x", 0x42);
  EXPECT_PRINTF("00042", "%.5o", 042);
  EXPECT_PRINTF("00042", "%#.5o", 042);

  EXPECT_PRINTF("  00042", "%7.5d", 42);
  EXPECT_PRINTF("  00042", "%7.5x", 0x42);
  EXPECT_PRINTF("   0x00042", "%#10.5x", 0x42);
  EXPECT_PRINTF("  00042", "%7.5o", 042);
  EXPECT_PRINTF("     00042", "%#10.5o", 042);

  EXPECT_PRINTF("00042  ", "%-7.5d", 42);
  EXPECT_PRINTF("00042  ", "%-7.5x", 0x42);
  EXPECT_PRINTF("0x00042   ", "%-#10.5x", 0x42);
  EXPECT_PRINTF("00042  ", "%-7.5o", 042);
  EXPECT_PRINTF("00042     ", "%-#10.5o", 042);
}